

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::sum_fine_to_coarse
               (MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio,Geometry *cgeom
               ,Geometry *param_7)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int ngrow;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  Periodicity PVar13;
  ulong local_3e0;
  long local_3c8;
  int kk;
  Box local_314;
  Array4<double> local_2f8;
  Array4<const_double> local_2b8;
  MFIter mfi;
  BoxArray crse_S_fine_BA;
  MultiFab crse_S_fine;
  
  ngrow = (S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] /
          ratio->vect[0];
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_2f8.p = (double *)&PTR__FabFactory_0074e8d0;
  MultiFab::MultiFab(&crse_S_fine,&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     ncomp,ngrow,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  MFIter::MFIter(&mfi,(FabArrayBase *)&crse_S_fine,true);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::growntilebox(&local_314,&mfi,ngrow);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2f8,&crse_S_fine.super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2b8,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi);
      if (0 < ncomp) {
        local_3e0 = 0;
        do {
          if (local_314.smallend.vect[2] <= local_314.bigend.vect[2]) {
            iVar4 = local_314.smallend.vect[2];
            do {
              if (local_314.smallend.vect[1] <= local_314.bigend.vect[1]) {
                uVar1 = ratio->vect[0];
                uVar2 = ratio->vect[1];
                uVar3 = ratio->vect[2];
                local_3c8 = (long)local_314.smallend.vect[1];
                do {
                  if (local_314.smallend.vect[0] <= local_314.bigend.vect[0]) {
                    lVar7 = (long)local_314.smallend.vect[0];
                    iVar8 = local_314.smallend.vect[0] * uVar1;
                    do {
                      if ((int)uVar3 < 1) {
                        dVar12 = 0.0;
                      }
                      else {
                        dVar12 = 0.0;
                        uVar10 = 0;
                        do {
                          if (0 < (int)uVar2) {
                            uVar9 = 0;
                            do {
                              if (0 < (int)uVar1) {
                                uVar6 = (ulong)uVar1;
                                iVar5 = iVar8 - local_2b8.begin.x;
                                do {
                                  dVar12 = dVar12 + local_2b8.p
                                                    [local_2b8.nstride * ((long)scomp + local_3e0) +
                                                     (int)((uVar3 * iVar4 + (int)uVar10) -
                                                          local_2b8.begin.z) * local_2b8.kstride +
                                                     (long)(int)(((int)uVar9 +
                                                                 (int)local_3c8 * uVar2) -
                                                                local_2b8.begin.y) *
                                                     CONCAT44(local_2b8.jstride._4_4_,
                                                              (int)local_2b8.jstride) + (long)iVar5]
                                  ;
                                  iVar5 = iVar5 + 1;
                                  uVar6 = uVar6 - 1;
                                } while (uVar6 != 0);
                              }
                              uVar9 = uVar9 + 1;
                            } while (uVar9 != uVar2);
                          }
                          uVar10 = uVar10 + 1;
                        } while (uVar10 != uVar3);
                      }
                      local_2f8.p
                      [((long)iVar4 - (long)local_2f8.begin.z) * local_2f8.kstride +
                       local_2f8.nstride * local_3e0 +
                       (local_3c8 - local_2f8.begin.y) *
                       CONCAT44(local_2f8.jstride._4_4_,(undefined4)local_2f8.jstride) +
                       (lVar7 - local_2f8.begin.x)] =
                           (double)(dVar12 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3)));
                      lVar7 = lVar7 + 1;
                      iVar8 = iVar8 + uVar1;
                    } while (local_314.bigend.vect[0] + 1 != (int)lVar7);
                  }
                  local_3c8 = local_3c8 + 1;
                } while (local_314.bigend.vect[1] + 1 != (int)local_3c8);
              }
              bVar11 = iVar4 != local_314.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar11);
          }
          local_3e0 = local_3e0 + 1;
        } while (local_3e0 != (uint)ncomp);
      }
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  PVar13 = Geometry::periodicity(cgeom);
  local_2b8.p = PVar13.period.vect._0_8_;
  local_2b8.jstride._0_4_ = PVar13.period.vect[2];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = ngrow;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = ngrow;
  mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,ngrow);
  local_2f8.p = (double *)0x0;
  local_2f8.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&S_crse->super_FabArray<amrex::FArrayBox>,&crse_S_fine.super_FabArray<amrex::FArrayBox>
             ,0,scomp,ncomp,(IntVect *)&mfi,(IntVect *)&local_2f8,(Periodicity *)&local_2b8,ADD,
             (CPC *)0x0,false);
  MultiFab::~MultiFab(&crse_S_fine);
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void sum_fine_to_coarse(const MultiFab& S_fine, MultiFab& S_crse,
                            int scomp, int ncomp, const IntVect& ratio,
                            const Geometry& cgeom, const Geometry& /*fgeom*/)
    {
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT(ratio == ratio[0]);
        AMREX_ASSERT(S_fine.nGrow() % ratio[0] == 0);

        const int nGrow = S_fine.nGrow() / ratio[0];

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, nGrow, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
            auto const& crsema = crse_S_fine.arrays();
            auto const& finema = S_fine.const_arrays();
            ParallelFor(crse_S_fine, IntVect(nGrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse_S_fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                //  NOTE: The tilebox is defined at the coarse level.
                const Box& bx = mfi.growntilebox(nGrow);
                Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                Array4<Real const> const& finearr = S_fine.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                {
                    amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                });
            }
        }

        S_crse.ParallelCopy(crse_S_fine, 0, scomp, ncomp, nGrow, 0,
                            cgeom.periodicity(), FabArrayBase::ADD);
    }